

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDop.cpp
# Opt level: O3

KDop<24U> * __thiscall NBvh3::KDop<24U>::operator+=(KDop<24U> *this,KDop<24U> *other)

{
  float fVar1;
  uint i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (other->mMin[lVar2] < this->mMin[lVar2]) {
      this->mMin[lVar2] = other->mMin[lVar2];
    }
    fVar1 = other->mMax[lVar2];
    if (this->mMax[lVar2] <= fVar1 && fVar1 != this->mMax[lVar2]) {
      this->mMax[lVar2] = fVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  return this;
}

Assistant:

KDop<K>& KDop<K>::operator += (const KDop<K>& other)
{
    for (unsigned i = 0; i < K / 2; ++i)
    {
        if (other.mMin[i] < mMin[i])
        {
            mMin[i] = other.mMin[i];
        }

        if (other.mMax[i] > mMax[i])
        {
            mMax[i] = other.mMax[i];
        }
    }

    return *this;
}